

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O3

sexp analyze_lambda(sexp ctx,sexp x,int depth)

{
  sexp psVar1;
  int iVar2;
  sexp psVar3;
  sexp psVar4;
  sexp psVar5;
  sexp psVar6;
  sexp psVar7;
  char *message;
  sexp tmp;
  sexp res;
  sexp ctx2;
  sexp body;
  sexp defs;
  sexp local_c8;
  sexp local_c0;
  sexp local_b8;
  sexp local_b0;
  sexp local_a8;
  sexp local_a0;
  sexp local_98;
  sexp_gc_var_t local_90;
  sexp_gc_var_t local_80;
  sexp_gc_var_t local_70;
  sexp_gc_var_t local_60;
  sexp_gc_var_t local_50;
  sexp_gc_var_t local_40;
  
  local_50.var = &local_c8;
  local_90.var = &local_c0;
  local_c0 = (sexp)0x43e;
  local_40.var = &local_b0;
  local_b0 = (sexp)0x43e;
  local_c8 = (sexp)0x43e;
  local_60.var = &local_98;
  local_98 = (sexp)&DAT_0000043e;
  local_70.var = &local_a8;
  local_a8 = (sexp)&DAT_0000043e;
  local_80.var = &local_b8;
  local_b8 = (sexp)0x43e;
  local_40.next = &local_90;
  local_90.next = (ctx->value).context.saves;
  local_50.next = &local_40;
  local_60.next = &local_50;
  local_70.next = &local_60;
  local_80.next = &local_70;
  (ctx->value).context.saves = &local_80;
  psVar5 = (x->value).type.cpl;
  if ((((((ulong)psVar5 & 3) == 0) && (psVar5->tag == 6)) &&
      (psVar3 = (psVar5->value).type.cpl, ((ulong)psVar3 & 3) == 0)) && (psVar3->tag == 6)) {
    psVar3 = sexp_length_op((sexp)0x0,(sexp)0x0,1,(psVar5->value).type.name);
    for (psVar5 = (((x->value).type.cpl)->value).type.name;
        (((ulong)psVar5 & 3) == 0 && (psVar5->tag == 6)); psVar5 = (psVar5->value).type.cpl) {
      psVar4 = (psVar5->value).type.name;
      iVar2 = sexp_idp(psVar4);
      if (iVar2 == 0) goto LAB_0012c26a;
      if (((long)psVar3 < 200) &&
         (psVar4 = sexp_memq_op(ctx,(sexp)0x0,2,psVar4,(psVar5->value).type.cpl),
         psVar4 != (sexp)&DAT_0000003e)) goto LAB_0012bf8b;
    }
    if (psVar5 == (sexp)&DAT_0000023e) {
LAB_0012bf94:
      local_c8 = sexp_copy_list_op(ctx,(sexp)0x0,1,(((x->value).type.cpl)->value).type.name);
      local_c0 = sexp_make_lambda(ctx,local_c8);
      if ((((ulong)local_c0 & 3) != 0) || (psVar5 = local_c0, local_c0->tag != 0x13)) {
        psVar5 = (x->value).type.slots;
        (local_c0->value).opcode.dl = psVar5;
        if ((((ulong)psVar5 & 3) != 0 || psVar5 == (sexp)0x0) || (psVar5->tag != 6)) {
          psVar5 = (((x->value).type.cpl)->value).type.slots;
          (local_c0->value).opcode.dl = psVar5;
        }
        if (((psVar5 == (sexp)0x0) || (((ulong)psVar5 & 3) != 0)) || (psVar5->tag != 6)) {
          (local_c0->value).opcode.dl =
               (((((x->value).type.cpl)->value).type.cpl)->value).type.slots;
        }
        local_b8 = sexp_make_child_context(ctx,local_c0);
        if ((((ulong)local_b8 & 3) != 0) || (psVar5 = local_b8, local_b8->tag != 0x13)) {
          local_c8 = sexp_flatten_dot(local_b8,(local_c0->value).type.cpl);
          psVar5 = sexp_extend_env(local_b8,(local_b8->value).type.cpl,local_c8,local_c0);
          (local_b8->value).type.cpl = psVar5;
          if ((((ulong)psVar5 & 3) != 0) || (psVar5->tag != 0x13)) {
            (psVar5->value).type.cpl = local_c0;
            local_b0 = analyze_seq(local_b8,(((x->value).type.cpl)->value).type.cpl,depth,1);
            if ((((ulong)local_b0 & 3) != 0) || (psVar5 = local_b0, local_b0->tag != 0x13)) {
              local_a8 = (sexp)&DAT_0000023e;
              for (psVar3 = (local_c0->value).type.getters;
                  (((ulong)psVar3 & 3) == 0 && (psVar3->tag == 6));
                  psVar3 = (psVar3->value).type.cpl) {
                local_c8 = (psVar3->value).type.name;
                psVar5 = (local_c8->value).type.name;
                psVar4 = (local_c8->value).type.cpl;
                psVar7 = (psVar5->value).type.name;
                if ((((ulong)psVar7 & 3) == 0) && (psVar7->tag == 6)) {
                  local_a0 = (psVar7->value).type.name;
                  local_c8 = sexp_cons_op(psVar4,(sexp)0x0,2,(psVar7->value).type.cpl,
                                          (psVar5->value).type.cpl);
                  local_c8 = sexp_cons_op(psVar4,(sexp)0x0,2,(sexp)&DAT_0000043e,local_c8);
                  (local_c8->value).type.slots =
                       (((((psVar3->value).type.name)->value).type.name)->value).type.slots;
                  psVar5 = analyze_lambda(psVar4,local_c8,depth);
                  psVar7 = local_a0;
                }
                else {
                  psVar5 = analyze(psVar4,(((psVar5->value).type.cpl)->value).type.name,depth,0);
                }
                if (((ulong)psVar5 & 3) == 0) {
                  if (psVar5->tag == 0x1c) {
                    (psVar5->value).type.name = psVar7;
                  }
                  else if (psVar5->tag == 0x13) goto LAB_0012bf31;
                }
                local_98 = psVar5;
                psVar6 = analyze_var_ref(psVar4,psVar7,(sexp_conflict *)0x0);
                psVar1 = local_98;
                if ((((ulong)psVar6 & 3) == 0) && (psVar5 = psVar6, psVar6->tag == 0x13))
                goto LAB_0012bf31;
                local_c8 = psVar6;
                local_a0 = psVar7;
                psVar5 = sexp_alloc_tagged_aux(psVar4,0x20,0x1f);
                (psVar5->value).type.name = psVar6;
                (psVar5->value).type.cpl = psVar1;
                if ((((ulong)psVar5 & 3) == 0) && (psVar5->tag == 0x13)) goto LAB_0012bf31;
                local_c8 = psVar5;
                sexp_push_op(psVar4,&local_a8,psVar5);
                psVar5 = local_a0;
                psVar7 = sexp_memq_op(psVar4,(sexp)0x0,2,local_a0,(local_c0->value).type.dl);
                if (psVar7 == (sexp)&DAT_0000003e) {
                  sexp_push_op(psVar4,&(local_c0->value).type.dl,psVar5);
                }
              }
              if ((((ulong)local_a8 & 3) == 0) && (local_a8->tag == 6)) {
                if ((((ulong)local_b0 & 3) == 0) && (local_b0->tag == 0x21)) {
                  psVar5 = (local_b0->value).type.name;
                }
                else {
                  local_c8 = sexp_alloc_tagged_aux(local_b8,0x18,0x21);
                  psVar5 = sexp_cons_op(local_b8,(sexp)0x0,2,local_b0,(sexp)&DAT_0000023e);
                  (local_c8->value).type.name = psVar5;
                  local_b0 = local_c8;
                }
                psVar5 = sexp_append2_op(local_b8,(sexp)0x0,2,local_a8,psVar5);
                (local_b0->value).type.name = psVar5;
                if ((((ulong)psVar5 & 3) == 0) && (psVar5->tag == 0x13)) goto LAB_0012bf31;
              }
              if ((((ulong)local_b0 & 3) != 0) || (psVar5 = local_b0, local_b0->tag != 0x13)) {
                (local_c0->value).type.slots = local_b0;
                psVar5 = local_c0;
              }
            }
          }
        }
      }
      goto LAB_0012bf31;
    }
    iVar2 = sexp_idp(psVar5);
    if (iVar2 == 0) {
LAB_0012c26a:
      message = "non-symbol parameter";
    }
    else {
      psVar5 = sexp_memq_op(ctx,(sexp)0x0,2,psVar5,(((x->value).type.cpl)->value).type.name);
      if (psVar5 == (sexp)&DAT_0000003e) goto LAB_0012bf94;
LAB_0012bf8b:
      message = "duplicate parameter";
    }
  }
  else {
    message = "bad lambda syntax";
    local_50.var = &local_c8;
  }
  psVar5 = sexp_compile_error(ctx,message,x);
LAB_0012bf31:
  (ctx->value).context.saves = local_90.next;
  return psVar5;
}

Assistant:

static sexp analyze_lambda (sexp ctx, sexp x, int depth) {
  int trailing_non_procs, verify_duplicates_p;
  sexp name, ls, ctx3;
  sexp_gc_var6(res, body, tmp, value, defs, ctx2);
  sexp_gc_preserve6(ctx, res, body, tmp, value, defs, ctx2);
  /* verify syntax */
  if (! (sexp_pairp(sexp_cdr(x)) && sexp_pairp(sexp_cddr(x))))
    sexp_return(res, sexp_compile_error(ctx, "bad lambda syntax", x));
  verify_duplicates_p = sexp_length_unboxed(sexp_cadr(x)) < 100;
  for (ls=sexp_cadr(x); sexp_pairp(ls); ls=sexp_cdr(ls))
    if (! sexp_idp(sexp_car(ls)))
      sexp_return(res, sexp_compile_error(ctx, "non-symbol parameter", x));
    else if (verify_duplicates_p && sexp_truep(sexp_memq(ctx, sexp_car(ls), sexp_cdr(ls))))
      sexp_return(res, sexp_compile_error(ctx, "duplicate parameter", x));
  if (! sexp_nullp(ls)) { /* verify rest param */
    if (! sexp_idp(ls))
      sexp_return(res, sexp_compile_error(ctx, "non-symbol parameter", x));
    else if (sexp_truep(sexp_memq(ctx, ls, sexp_cadr(x))))
      sexp_return(res, sexp_compile_error(ctx, "duplicate parameter", x));
  }
  /* build lambda and analyze body */
  res = sexp_make_lambda(ctx, tmp=sexp_copy_list(ctx, sexp_cadr(x)));
  if (sexp_exceptionp(res)) sexp_return(res, res);
  sexp_lambda_source(res) = sexp_pair_source(x);
  if (! (sexp_lambda_source(res) && sexp_pairp(sexp_lambda_source(res))))
    sexp_lambda_source(res) = sexp_pair_source(sexp_cdr(x));
  if (! (sexp_lambda_source(res) && sexp_pairp(sexp_lambda_source(res))))
    sexp_lambda_source(res) = sexp_pair_source(sexp_cddr(x));
  ctx2 = sexp_make_child_context(ctx, res);
  if (sexp_exceptionp(ctx2)) sexp_return(res, ctx2);
  tmp = sexp_flatten_dot(ctx2, sexp_lambda_params(res));
  sexp_context_env(ctx2) = sexp_extend_env(ctx2, sexp_context_env(ctx2), tmp, res);
  if (sexp_exceptionp(sexp_context_env(ctx2))) sexp_return(res, sexp_context_env(ctx2));
  sexp_env_lambda(sexp_context_env(ctx2)) = res;
  body = analyze_seq(ctx2, sexp_cddr(x), depth, 1);
  if (sexp_exceptionp(body)) sexp_return(res, body);
  /* delayed analyze internal defines */
  trailing_non_procs = 0;
  defs = SEXP_NULL;
  for (ls=sexp_lambda_defs(res); sexp_pairp(ls); ls=sexp_cdr(ls)) {
    tmp = sexp_car(ls);
    ctx3 = sexp_cdr(tmp);
    if (sexp_pairp(sexp_caar(tmp))) {
      name = sexp_caaar(tmp);
      tmp = sexp_cons(ctx3, sexp_cdaar(tmp), sexp_cdar(tmp));
      tmp = sexp_cons(ctx3, SEXP_VOID, tmp);
      sexp_pair_source(tmp) = sexp_pair_source(sexp_caar(ls));
      value = analyze_lambda(ctx3, tmp, depth);
    } else {
      name = sexp_caar(tmp);
      value = analyze(ctx3, sexp_cadar(tmp), depth, 0);
    }
    if (sexp_exceptionp(value)) sexp_return(res, value);
    if (sexp_lambdap(value)) sexp_lambda_name(value) = name;
    tmp = analyze_var_ref(ctx3, name, NULL);
    if (sexp_exceptionp(tmp)) sexp_return(res, tmp);
    tmp = sexp_make_set(ctx3, tmp, value);
    if (sexp_exceptionp(tmp)) sexp_return(res, tmp);
    sexp_push(ctx3, defs, tmp);
    if (!sexp_lambdap(value)) trailing_non_procs = 1;
    if (trailing_non_procs || !SEXP_USE_UNBOXED_LOCALS)
      sexp_insert(ctx3, sexp_lambda_sv(res), name);
  }
  if (sexp_pairp(defs)) {
    if (! sexp_seqp(body)) {
      tmp = sexp_alloc_type(ctx2, seq, SEXP_SEQ);
      sexp_seq_ls(tmp) = sexp_list1(ctx2, body);
      body = tmp;
    }
    sexp_seq_ls(body) = sexp_append2(ctx2, defs, sexp_seq_ls(body));
    if (sexp_exceptionp(sexp_seq_ls(body))) sexp_return(res, sexp_seq_ls(body));
  }
  if (sexp_exceptionp(body)) res = body;
  else sexp_lambda_body(res) = body;
 cleanup:
  sexp_gc_release6(ctx);
  return res;
}